

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall Client::handleDeleteUserRequest(Client *this,DeleteUserRequest request)

{
  CommunicationStack *pCVar1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  Event EVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_20;
  
  if (this->user == (User *)0x0) {
    pCVar1 = this->communicationStack;
    EVar2 = DeleteUserResponse::operator_cast_to_basic_json((DeleteUserResponse *)&local_20);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_20,EVar2.m_value.object);
    this_00 = &local_20;
  }
  else {
    Database::deleteUser(&server.database,request.id);
    pCVar1 = this->communicationStack;
    EVar2 = DeleteUserResponse::operator_cast_to_basic_json((DeleteUserResponse *)&local_30);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_30,EVar2.m_value.object);
    this_00 = &local_30;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(this_00);
  return;
}

Assistant:

void Client::handleDeleteUserRequest(DeleteUserRequest request)
{
	if(user == nullptr)
	{
		communicationStack->sendEvent(DeleteUserResponse(false));
		return;
	}

	try
	{
		server.database.deleteUser(request.id);
	}
	catch (DatabaseException& e)
	{
		std::cout << e.what() << std::endl;
		communicationStack->sendEvent(DeleteUserResponse(false));
		return;
	}

	communicationStack->sendEvent(DeleteUserResponse(true));
}